

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventFilter.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* (anonymous_namespace)::filterEvents_abi_cxx11_(Session *session,EventFilter *filter)

{
  TestStream *in_RDI;
  FilterAdapter adapter;
  FilterAdapter *in_stack_000000b8;
  Session *in_stack_000000c0;
  char *in_stack_000002d0;
  TestStream *in_stack_000002d8;
  
  TestStream::TestStream(in_RDI);
  binlog::Session::consume<(anonymous_namespace)::FilterAdapter>
            (in_stack_000000c0,in_stack_000000b8);
  streamToEvents_abi_cxx11_(in_stack_000002d8,in_stack_000002d0);
  anon_unknown.dwarf_1dd592::FilterAdapter::~FilterAdapter((FilterAdapter *)0x25d306);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> filterEvents(binlog::Session& session, binlog::EventFilter& filter)
{
  FilterAdapter adapter{filter, {}};
  session.consume(adapter);
  return streamToEvents(adapter.stream, "%S %m");
}